

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

bool __thiscall
basisu::vector<basist::ktx2_transcoder::key_value>::try_reserve
          (vector<basist::ktx2_transcoder::key_value> *this,size_t new_capacity_size_t)

{
  bool bVar1;
  vector<basist::ktx2_transcoder::key_value> *this_00;
  ulong in_RSI;
  long in_RDI;
  vector<basist::ktx2_transcoder::key_value> tmp;
  uint32_t new_capacity;
  undefined2 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaa;
  undefined1 in_stack_ffffffffffffffab;
  uint32_t in_stack_ffffffffffffffac;
  vector<basist::ktx2_transcoder::key_value> *in_stack_ffffffffffffffb0;
  vector<basist::ktx2_transcoder::key_value> *in_stack_ffffffffffffffc0;
  vector<basist::ktx2_transcoder::key_value> *in_stack_ffffffffffffffc8;
  vector<basist::ktx2_transcoder::key_value> local_30;
  uint local_1c [7];
  
  if (0xffffffff < in_RSI) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,0x1fa,
                  "bool basisu::vector<basist::ktx2_transcoder::key_value>::try_reserve(size_t) [T = basist::ktx2_transcoder::key_value]"
                 );
  }
  local_1c[0] = (uint)in_RSI;
  if (*(uint *)(in_RDI + 0xc) < local_1c[0]) {
    bVar1 = increase_capacity(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                              (bool)in_stack_ffffffffffffffab,(bool)in_stack_ffffffffffffffaa);
    if (!bVar1) {
      return false;
    }
  }
  else if (local_1c[0] < *(uint *)(in_RDI + 0xc)) {
    vector(&local_30);
    this_00 = (vector<basist::ktx2_transcoder::key_value> *)
              helpers::maximum<unsigned_int>((uint *)(in_RDI + 8),local_1c);
    increase_capacity(this_00,in_stack_ffffffffffffffac,(bool)in_stack_ffffffffffffffab,
                      (bool)in_stack_ffffffffffffffaa);
    operator=(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    swap(this_00,(vector<basist::ktx2_transcoder::key_value> *)
                 CONCAT44(in_stack_ffffffffffffffac,
                          CONCAT13(in_stack_ffffffffffffffab,
                                   CONCAT12(in_stack_ffffffffffffffaa,in_stack_ffffffffffffffa8))));
    ~vector(this_00);
  }
  return true;
}

Assistant:

inline bool try_reserve(size_t new_capacity_size_t)
      {
         if (new_capacity_size_t > UINT32_MAX)
         {
            assert(0);
            return false;
         }

         uint32_t new_capacity = (uint32_t)new_capacity_size_t;

         if (new_capacity > m_capacity)
         {
            if (!increase_capacity(new_capacity, false))
               return false;
         }
         else if (new_capacity < m_capacity)
         {
            // Must work around the lack of a "decrease_capacity()" method.
            // This case is rare enough in practice that it's probably not worth implementing an optimized in-place resize.
            vector tmp;
            tmp.increase_capacity(helpers::maximum(m_size, new_capacity), false);
            tmp = *this;
            swap(tmp);
         }

         return true;
      }